

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_Polypoint2D(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var9;
  CX3DImporter_NodeElement *pParentElement;
  _List_node_base *p_Var10;
  string *psVar11;
  uint uVar12;
  ulong uVar13;
  CX3DImporter_NodeElement *ne;
  string an;
  string use;
  string def;
  list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> point;
  allocator<char> local_c9;
  CX3DImporter_NodeElement *local_c8;
  string local_c0;
  string local_a0;
  string local_80;
  list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_60;
  X3DImporter *local_48;
  undefined8 uStack_40;
  undefined4 extraout_var_00;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_60.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_60;
  local_60.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl._M_node.
  _M_size = 0;
  local_c8 = (CX3DImporter_NodeElement *)0x0;
  local_60.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_60.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar7) {
    uVar13 = 0;
    local_48 = this;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,(char *)CONCAT44(extraout_var,iVar8),&local_c9);
      iVar8 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar8);
        psVar11 = &local_80;
LAB_0068e86b:
        pcVar3 = (char *)psVar11->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar11,0,pcVar3,(ulong)__s);
        this = local_48;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar8);
          psVar11 = &local_a0;
          goto LAB_0068e86b;
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_c0);
        if (((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_c0), iVar8 != 0))
           && (iVar8 = std::__cxx11::string::compare((char *)&local_c0), iVar8 != 0)) {
          iVar8 = std::__cxx11::string::compare((char *)&local_c0);
          if (iVar8 == 0) {
            XML_ReadNode_GetAttrVal_AsListVec2f(this,(int)uVar13,&local_60);
          }
          else {
            Throw_IncorrectAttr(this,&local_c0);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      uVar12 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar12;
    } while (uVar7 != uVar12);
  }
  if (local_a0._M_string_length == 0) {
    pParentElement = (CX3DImporter_NodeElement *)operator_new(0x78);
    pCVar4 = this->NodeElement_Cur;
    pParentElement->Type = ENET_Polypoint2D;
    (pParentElement->ID)._M_dataplus._M_p = (pointer)&(pParentElement->ID).field_2;
    (pParentElement->ID)._M_string_length = 0;
    (pParentElement->ID).field_2._M_local_buf[0] = '\0';
    pParentElement->Parent = pCVar4;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pParentElement->Child;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pParentElement->Child;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pParentElement->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Geometry2D_008da818;
    *(CX3DImporter_NodeElement **)&pParentElement[1].Type = pParentElement + 1;
    pParentElement[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(pParentElement + 1);
    pParentElement[1].ID._M_dataplus._M_p = (pointer)0x0;
    pParentElement[1].ID.field_2._M_local_buf[0] = '\x01';
    p_Var9 = local_60.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    local_c8 = pParentElement;
    if (local_80._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&pParentElement->ID);
      p_Var9 = local_60.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
    }
    for (; p_Var9 != (_List_node_base *)&local_60; p_Var9 = p_Var9->_M_next) {
      local_48 = (X3DImporter *)p_Var9[1]._M_next;
      uStack_40 = 0;
      p_Var10 = (_List_node_base *)operator_new(0x20);
      p_Var10[1]._M_next = (_List_node_base *)local_48;
      *(undefined4 *)&p_Var10[1]._M_prev = 0;
      std::__detail::_List_node_base::_M_hook(p_Var10);
      pParentElement[1].ID._M_dataplus._M_p = pParentElement[1].ID._M_dataplus._M_p + 1;
    }
    pParentElement[1].ID._M_string_length = 1;
    iVar8 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar8 == '\0') {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Polypoint2D","");
      ParseNode_Metadata(this,pParentElement,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)pParentElement;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)pParentElement;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_80._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_a0,ENET_Polypoint2D,&local_c8);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_a0);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_c8;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &pCVar4->Child;
  }
  psVar1 = &(plVar5->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var9 = local_60.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  while (p_Var9 != (_List_node_base *)&local_60) {
    p_Var10 = (((_List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
               &p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var9,0x18);
    p_Var9 = p_Var10;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_Polypoint2D()
{
    std::string def, use;
    std::list<aiVector2D> point;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("point", point, XML_ReadNode_GetAttrVal_AsListVec2f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Polypoint2D, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_Polypoint2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		// convert vec2 to vec3
		for(std::list<aiVector2D>::iterator it2 = point.begin(); it2 != point.end(); ++it2)
		{
			((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices.push_back(aiVector3D(it2->x, it2->y, 0));
		}

		((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 1;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Polypoint2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}